

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void alphargbblend_argb32
               (quint32 *dst,uint coverage,QRgba64 *srcLinear,quint32 src,QColorTrcLut *colorProfile
               )

{
  uint uVar1;
  undefined7 uVar2;
  ulong uVar3;
  int const_alpha;
  QRgba64 slinear;
  long in_FS_OFFSET;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar10;
  byte bVar11;
  ushort uVar12;
  ushort uVar13;
  undefined1 auVar9 [16];
  QRgb s;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (coverage != 0xff000000) {
    if ((coverage == 0xffffffff) && (0xfeffffff < src)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        blend_pixel(dst,src);
        return;
      }
      goto LAB_005bfa75;
    }
    uVar1 = *dst;
    if (uVar1 < 0xff000000) {
      const_alpha = qRgbAvg(coverage);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        blend_pixel(dst,src,const_alpha);
        return;
      }
      goto LAB_005bfa75;
    }
    if (colorProfile == (QColorTrcLut *)0x0) {
      local_3c = uVar1;
      blend_pixel(&local_3c,src);
      bVar11 = (byte)(coverage >> 0x18);
      uVar2 = CONCAT25((short)(((uint7)bVar11 << 0x30) >> 0x28),
                       CONCAT14((char)(coverage >> 0x10),coverage));
      uVar8 = (ushort)coverage;
      uVar3 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar2 >> 0x20),coverage) >> 0x18),
                              CONCAT12((char)(coverage >> 8),uVar8)) & 0xffffffff00ffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = CONCAT62((int6)(uVar3 >> 0x10),uVar8) & 0xffffffffffff00ff;
      auVar9 = auVar9 ^ _DAT_0060d6f0;
      uVar8 = auVar9._0_2_ * (ushort)(byte)uVar1 + (ushort)(byte)local_3c * (uVar8 & 0xff);
      uVar10 = auVar9._2_2_ * (ushort)(byte)(uVar1 >> 8) +
               (ushort)(byte)(local_3c >> 8) * (short)(uVar3 >> 0x10);
      uVar12 = auVar9._4_2_ * (ushort)(byte)(uVar1 >> 0x10) +
               (ushort)(byte)(local_3c >> 0x10) * (short)((uint7)uVar2 >> 0x20);
      uVar13 = auVar9._6_2_ * (ushort)(byte)(uVar1 >> 0x18) +
               (ushort)(byte)(local_3c >> 0x18) * (ushort)bVar11;
      uVar8 = (uVar8 >> 8) + uVar8 + 0x80;
      uVar4 = (uVar10 >> 8) + uVar10 + 0x80;
      uVar5 = (uVar12 >> 8) + uVar12 + 0x80;
      uVar6 = (uVar13 >> 8) + uVar13 + 0x80;
      uVar10 = uVar8 >> 8;
      uVar12 = uVar4 >> 8;
      uVar13 = uVar5 >> 8;
      uVar7 = uVar6 >> 8;
      *dst = CONCAT13((uVar7 != 0) * (uVar7 < 0x100) * (char)(uVar6 >> 8) - (0xff < uVar7),
                      CONCAT12((uVar13 != 0) * (uVar13 < 0x100) * (char)(uVar5 >> 8) -
                               (0xff < uVar13),
                               CONCAT11((uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar4 >> 8) -
                                        (0xff < uVar12),
                                        (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar8 >> 8) -
                                        (0xff < uVar10))));
    }
    else {
      if ((short)(srcLinear->rgba >> 0x30) == -1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          rgbBlendPixel(dst,coverage,(QRgba64)srcLinear->rgba,colorProfile);
          return;
        }
        goto LAB_005bfa75;
      }
      local_3c = uVar1;
      blend_pixel(&local_3c,src);
      slinear = QColorTrcLut::toLinear64(colorProfile,local_3c);
      rgbBlendPixel(dst,coverage,slinear,colorProfile);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005bfa75:
  __stack_chk_fail();
}

Assistant:

static inline void alphargbblend_argb32(quint32 *dst, uint coverage, const QRgba64 &srcLinear, quint32 src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff && qAlpha(src) == 255) {
        blend_pixel(*dst, src);
    } else if (*dst < 0xff000000) {
        // Give up and do a naive gray alphablend. Needed to deal with ARGB32 and invalid ARGB32_premultiplied, see QTBUG-60571
        blend_pixel(*dst, src, qRgbAvg(coverage));
    } else if (!colorProfile) {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then a naive blend with glyph shape
        *dst = rgbBlend(*dst, s, coverage);
    } else if (srcLinear.isOpaque()) {
        rgbBlendPixel(dst, coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgb s = *dst;
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        QRgba64 s64 = colorProfile ? colorProfile->toLinear64(s) : QRgba64::fromArgb32(s);
        rgbBlendPixel(dst, coverage, s64, colorProfile);
    }
}